

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDVertexEdgeProperties * __thiscall
ON_SubDVertex::EdgeProperties
          (ON_SubDVertexEdgeProperties *__return_storage_ptr__,ON_SubDVertex *this)

{
  char cVar1;
  ushort uVar2;
  ulong uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  ushort uVar7;
  ulong uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  ushort uVar11;
  unsigned_short uVar12;
  ulong uVar13;
  unsigned_short uVar14;
  ushort uVar15;
  ushort uVar16;
  unsigned_short uVar17;
  bool bVar18;
  
  __return_storage_ptr__->m_unset_edge_count = 0;
  __return_storage_ptr__->m_smooth_edge_count = 0;
  __return_storage_ptr__->m_crease_edge_count = 0;
  __return_storage_ptr__->m_wire_edge_count = 0;
  __return_storage_ptr__->m_boundary_edge_count = 0;
  __return_storage_ptr__->m_interior_edge_count = 0;
  __return_storage_ptr__->m_nonmanifold_edge_count = 0;
  __return_storage_ptr__->m_min_edge_face_count = 0;
  __return_storage_ptr__->m_max_edge_face_count = 0;
  uVar3._0_2_ = this->m_edge_count;
  uVar3._2_2_ = this->m_face_count;
  uVar3._4_2_ = this->m_edge_capacity;
  uVar3._6_2_ = this->m_face_capacity;
  __return_storage_ptr__->m_edge_count = (short)(int)uVar3;
  __return_storage_ptr__->m_face_count = (short)((uint)(int)uVar3 >> 0x10);
  if ((undefined2)uVar3 == 0) {
    uVar12 = 0;
  }
  else {
    bVar18 = true;
    uVar13 = 0;
    uVar6 = 0;
    uVar5 = 0;
    uVar4 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar17 = 0;
    uVar12 = 0;
    do {
      uVar8 = this->m_edges[uVar13].m_ptr & 0xfffffffffffffff8;
      if (uVar8 == 0) {
        uVar12 = uVar12 + 1;
      }
      else {
        cVar1 = *(char *)(uVar8 + 0x60);
        if ((cVar1 == '\x01') || (cVar1 == '\x04')) {
          uVar17 = uVar17 + 1;
        }
        else if (cVar1 == '\x02') {
          uVar10 = uVar10 + 1;
        }
        else {
          uVar9 = uVar9 + 1;
        }
        uVar2 = *(ushort *)(uVar8 + 100);
        uVar7 = uVar2;
        uVar11 = uVar2;
        if (((!bVar18) && (uVar11 = uVar15, uVar16 <= uVar2)) && (uVar7 = uVar16, uVar15 < uVar2)) {
          uVar11 = uVar2;
        }
        if (uVar2 == 2) {
          uVar14 = uVar14 + 1;
        }
        else if (uVar2 == 1) {
          uVar4 = uVar4 + 1;
        }
        else if (uVar2 == 0) {
          uVar5 = uVar5 + 1;
        }
        else {
          uVar6 = uVar6 + 1;
        }
        bVar18 = false;
        uVar16 = uVar7;
        uVar15 = uVar11;
      }
      uVar13 = uVar13 + 1;
    } while ((uVar3 & 0xffff) != uVar13);
    __return_storage_ptr__->m_smooth_edge_count = uVar17;
    __return_storage_ptr__->m_crease_edge_count = uVar10;
    __return_storage_ptr__->m_unset_edge_count = uVar9;
    __return_storage_ptr__->m_min_edge_face_count = uVar16;
    __return_storage_ptr__->m_max_edge_face_count = uVar15;
    __return_storage_ptr__->m_interior_edge_count = uVar14;
    __return_storage_ptr__->m_boundary_edge_count = uVar4;
    __return_storage_ptr__->m_wire_edge_count = uVar5;
    __return_storage_ptr__->m_nonmanifold_edge_count = uVar6;
  }
  __return_storage_ptr__->m_null_edge_count = uVar12;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDVertexEdgeProperties ON_SubDVertex::EdgeProperties() const
{
  ON_SubDVertexEdgeProperties ep;

  ep.m_edge_count = m_edge_count;
  ep.m_face_count = m_face_count;

  bool bFirstEdge = true;
  for (unsigned short vei = 0; vei < ep.m_edge_count; vei++)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
    {
      ep.m_null_edge_count++;
      continue;
    }

    if (e->IsCrease())
      ep.m_crease_edge_count++;
    else if (e->IsSmooth())
      ep.m_smooth_edge_count++;
    else
      ep.m_unset_edge_count++;

    const unsigned short edge_face_count = e->m_face_count;
    if (bFirstEdge)
    {
      bFirstEdge = false;
      ep.m_min_edge_face_count = edge_face_count;
      ep.m_max_edge_face_count = edge_face_count;
    }
    else if (edge_face_count < ep.m_min_edge_face_count)
      ep.m_min_edge_face_count = edge_face_count;
    else if (edge_face_count > ep.m_max_edge_face_count)
      ep.m_max_edge_face_count = edge_face_count;

    if (0 == edge_face_count)
      ep.m_wire_edge_count++;
    else if (1 == edge_face_count)
      ep.m_boundary_edge_count++;
    else if (2 == edge_face_count)
      ep.m_interior_edge_count++;
    else
      ep.m_nonmanifold_edge_count++;

  }
  return ep;
}